

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

CTPNStm * __thiscall
CTcParser::parse_default(CTcParser *this,int *err,CTPNStmSwitch *enclosing_switch)

{
  byte bVar1;
  tc_toktyp_t tVar2;
  CTPNStmDefault *this_00;
  CTPNStm *pCVar3;
  
  this_00 = (CTPNStmDefault *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x28,(size_t)err);
  CTPNStmDefault::CTPNStmDefault(this_00);
  bVar1 = (enclosing_switch->super_CTPNStmSwitchBase).field_0x3c;
  if ((bVar1 & 1) != 0) {
    CTcTokenizer::log_error(0x2b4e);
    bVar1 = (enclosing_switch->super_CTPNStmSwitchBase).field_0x3c;
  }
  (enclosing_switch->super_CTPNStmSwitchBase).field_0x3c = bVar1 | 1;
  tVar2 = CTcTokenizer::next(G_tok);
  if (tVar2 == TOKT_COLON) {
    CTcTokenizer::next(G_tok);
  }
  else {
    CTcTokenizer::log_error_curtok(G_tok,0x2b4d);
  }
  pCVar3 = parse_stm(this,err,enclosing_switch,0);
  (this_00->super_CTPNStmDefaultBase).stm_ = pCVar3;
  return (CTPNStm *)this_00;
}

Assistant:

CTPNStm *CTcParser::parse_default(int *err, CTPNStmSwitch *enclosing_switch)
{
    CTPNStm *stm;
    CTPNStmDefault *default_stm;

    /* create the 'default' statement node */
    default_stm = new CTPNStmDefault();

    /* 
     *   if the enclosing 'switch' already has a 'default' label, it's an
     *   error; continue anyway, since we still want to finish parsing the
     *   syntax 
     */
    if (enclosing_switch->get_has_default())
        G_tok->log_error(TCERR_DEFAULT_REDEF);

    /* mark the switch as having a 'default' case */
    enclosing_switch->set_has_default();

    /* skip the 'default' node, and require the colon */
    if (G_tok->next() == TOKT_COLON)
    {
        /* skip the colon */
        G_tok->next();
    }
    else
    {
        /* 
         *   log an error, and keep going, assuming that the token was
         *   accidentally omitted 
         */
        G_tok->log_error_curtok(TCERR_REQ_DEFAULT_COLON);
    }

    /* 
     *   parse the labeled statement - it's directly within this same
     *   enclosing switch, because a 'default' label doesn't create a new
     *   expression nesting level (hence another 'case' label immediately
     *   following without an intervening statement is perfectly valid) 
     */
    stm = parse_stm(err, enclosing_switch, FALSE);

    /* set the statement in the 'default' node */
    default_stm->set_stm(stm);

    /* return the 'default' node */
    return default_stm;
}